

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_end(bitstream *str)

{
  int iVar1;
  uint32_t *in_RDI;
  uint32_t one;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = 1;
  if (in_RDI[0xb] == 1) {
    iVar2 = vs_align_byte((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          ,(vs_align_byte_mode)((ulong)in_RDI >> 0x20));
  }
  else {
    if (in_RDI[0xb] != 3) {
      abort();
    }
    iVar1 = vs_u((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,1
                );
    if (iVar1 == 0) {
      if (iVar2 == 1) {
        iVar2 = vs_align_byte((bitstream *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (vs_align_byte_mode)((ulong)in_RDI >> 0x20));
      }
      else {
        fprintf(_stderr,"Wrong RBSP trailing bit!\n");
        iVar2 = 1;
      }
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int vs_end(struct bitstream *str) {
	uint32_t one = 1;
	switch (str->type) {
		case VS_H262:
			return vs_align_byte(str, VS_ALIGN_0);
		case VS_H264:
			if (vs_u(str, &one, 1))
				return 1;
			if (one != 1) {
				fprintf (stderr, "Wrong RBSP trailing bit!\n");
				return 1;
			}
			return vs_align_byte(str, VS_ALIGN_0);
			/* XXX: add the cabac special case */
		default:
			abort();
	}
}